

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QFlags<Qt::AlignmentFlag> qvariant_cast<QFlags<Qt::AlignmentFlag>>(QVariant *v)

{
  bool bVar1;
  QMetaType QVar2;
  QFlags<Qt::AlignmentFlag> *pQVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  long in_FS_OFFSET;
  QMetaType targetType;
  QFlags<Qt::AlignmentFlag> t;
  QMetaType *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QMetaType::fromType<QFlags<Qt::AlignmentFlag>>();
  QVariant::Private::type((Private *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  bVar1 = operator==((QMetaType *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (bVar1) {
    pQVar3 = QVariant::Private::get<QFlags<Qt::AlignmentFlag>>((Private *)0x84f87f);
    local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         (pQVar3->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  else {
    local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i = (QFlagsStorage<Qt::AlignmentFlag>)0xaaaaaaaa;
    memset(&local_c,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x84f8ac);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0x84f8c5);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar2.d_ptr,&local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}